

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

Optional<llbuild::buildsystem::BuildValue> * __thiscall
anon_unknown.dwarf_35995e::BuildSystemImpl::build
          (Optional<llbuild::buildsystem::BuildValue> *__return_storage_ptr__,BuildSystemImpl *this,
          BuildKey *key)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  Optional<llbuild::buildsystem::BuildValue> *pOVar4;
  ValueType *__x;
  Optional<llbuild::buildsystem::BuildValue> *extraout_RAX;
  Optional<llbuild::buildsystem::BuildValue> *extraout_RAX_00;
  Optional<llbuild::buildsystem::BuildValue> *extraout_RAX_01;
  ValueType result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  BinaryDecoder local_b0;
  Child local_98 [2];
  long local_88 [12];
  undefined4 extraout_var;
  
  iVar3 = llbuild::basic::sys::raiseOpenFileLimit(0x800);
  if (iVar3 == 0) {
    this->buildWasAborted = false;
    pcVar1 = (key->key).key._M_dataplus._M_p;
    local_98[0].twine = (Twine *)local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_98,pcVar1,pcVar1 + (key->key).key._M_string_length);
    __x = llbuild::core::BuildEngine::build(&this->buildEngine,(KeyType *)local_98);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__x);
    if (local_98[0].twine != (Twine *)local_88) {
      operator_delete(local_98[0].twine,local_88[0] + 1);
    }
    llvm::
    StringMap<std::unique_ptr<llbuild::buildsystem::ShellCommandHandler,_std::default_delete<llbuild::buildsystem::ShellCommandHandler>_>,_llvm::MallocAllocator>
    ::clear(&this->shellHandlers);
    if (this->buildWasAborted == true) {
      (__return_storage_ptr__->Storage).hasVal = false;
      pOVar4 = extraout_RAX;
    }
    else {
      local_b0.data.Length =
           (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_b0.data.Data =
           (char *)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      local_b0.pos = 0;
      llbuild::buildsystem::BuildValue::BuildValue((BuildValue *)local_98,&local_b0);
      (__return_storage_ptr__->Storage).hasVal = true;
      llbuild::buildsystem::BuildValue::BuildValue
                ((BuildValue *)__return_storage_ptr__,(BuildValue *)local_98);
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_98);
      pOVar4 = extraout_RAX_00;
    }
    if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pOVar4 = extraout_RAX_01;
    }
  }
  else {
    pcVar1 = (this->mainFilename)._M_dataplus._M_p;
    sVar2 = (this->mainFilename)._M_string_length;
    llvm::Twine::Twine((Twine *)local_98,"failed to raise open file limit");
    local_b0.data.Data = (char *)0x0;
    local_b0.data.Length = local_b0.data.Length & 0xffffffff00000000;
    iVar3 = (*this->delegate->_vptr_BuildSystemDelegate[3])
                      (this->delegate,pcVar1,sVar2,&local_b0,local_98);
    pOVar4 = (Optional<llbuild::buildsystem::BuildValue> *)CONCAT44(extraout_var,iVar3);
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  return pOVar4;
}

Assistant:

llvm::Optional<BuildValue> BuildSystemImpl::build(BuildKey key) {

  if (basic::sys::raiseOpenFileLimit() != 0) {
    error(getMainFilename(), "failed to raise open file limit");
    return None;
  }

  // Build the target.
  buildWasAborted = false;
  auto result = buildEngine.build(key.toData());
    
  // Clear out the shell handlers, as we do not want to hold on to them across
  // multiple builds.
  shellHandlers.clear();

  if (buildWasAborted)
    return None;
  return BuildValue::fromData(result);
}